

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::GenerateNodeGraph
          (LWOImporter *this,
          map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
          *apcNodes)

{
  _Rb_tree_header *p_Var1;
  undefined1 *__s;
  _Base_ptr *pp_Var2;
  uint uVar3;
  _Base_ptr p_Var4;
  SharedPostProcessInfo *__n;
  mapped_type paVar5;
  aiNode **ppaVar6;
  LWOImporter *pLVar7;
  _func_int **pp_Var8;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  *pmVar9;
  aiNode *paVar10;
  aiNode *paVar11;
  size_t sVar12;
  long *plVar13;
  mapped_type *ppaVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  runtime_error *this_00;
  long *plVar18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  aiNode *paVar21;
  ulong uVar22;
  bool bVar23;
  uint16_t parentIndex;
  MakeLeftHandedProcess maker;
  FlipWindingOrderProcess flipper;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  mapPivot;
  undefined2 local_ba;
  MakeLeftHandedProcess local_b8;
  long lStack_a0;
  FlipWindingOrderProcess local_98;
  LWOImporter *local_78;
  aiNode *local_70;
  map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  *local_68;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  local_60;
  
  paVar10 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar10);
  this->pScene->mRootNode = paVar10;
  (paVar10->mName).length = 9;
  builtin_strncpy((paVar10->mName).data,"<LWORoot>",10);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var15 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(apcNodes->_M_t)._M_impl.super__Rb_tree_header;
  local_78 = this;
  paVar11 = paVar10;
  pmVar9 = apcNodes;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var15 != p_Var1) {
    do {
      local_68 = pmVar9;
      local_70 = paVar11;
      p_Var4 = p_Var15[1]._M_parent[0x22]._M_parent;
      local_ba = (undefined2)p_Var4[9]._M_color;
      paVar11 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar11);
      p_Var20 = p_Var15[1]._M_parent;
      __s = &p_Var20->field_0x4;
      local_98.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)&local_98.super_BaseProcess.progress;
      sVar12 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,__s,&p_Var20->field_0x4 + sVar12);
      plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x70efbc);
      local_b8.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)&local_b8.super_BaseProcess.progress;
      plVar18 = plVar13 + 2;
      if ((ProgressHandler **)*plVar13 == (ProgressHandler **)plVar18) {
        local_b8.super_BaseProcess.progress = (ProgressHandler *)*plVar18;
        lStack_a0 = plVar13[3];
      }
      else {
        local_b8.super_BaseProcess.progress = (ProgressHandler *)*plVar18;
        local_b8.super_BaseProcess._vptr_BaseProcess = (_func_int **)*plVar13;
      }
      pp_Var8 = local_b8.super_BaseProcess._vptr_BaseProcess;
      __n = (SharedPostProcessInfo *)plVar13[1];
      *plVar13 = (long)plVar18;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      local_b8.super_BaseProcess.shared = __n;
      if (__n < (SharedPostProcessInfo *)0x400) {
        (paVar11->mName).length = (ai_uint32)__n;
        memcpy((paVar11->mName).data,local_b8.super_BaseProcess._vptr_BaseProcess,(size_t)__n);
        (paVar11->mName).data[(long)__n] = '\0';
      }
      if ((ProgressHandler **)pp_Var8 != &local_b8.super_BaseProcess.progress) {
        operator_delete(pp_Var8);
      }
      apcNodes = local_68;
      if ((ProgressHandler **)local_98.super_BaseProcess._vptr_BaseProcess !=
          &local_98.super_BaseProcess.progress) {
        operator_delete(local_98.super_BaseProcess._vptr_BaseProcess);
      }
      paVar10 = local_70;
      p_Var15[1]._M_parent[0x22]._M_parent = (_Base_ptr)paVar11;
      p_Var20 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var19 = &p_Var1->_M_header;
      paVar21 = local_70;
      if (p_Var20 != (_Base_ptr)0x0) {
        do {
          bVar23 = (ushort)(short)*(size_t *)(p_Var20 + 1) < (ushort)local_ba;
          if (!bVar23) {
            p_Var19 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[bVar23];
        } while (p_Var20 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var19 != p_Var1) &&
           ((ushort)(short)((_Rb_tree_header *)p_Var19)->_M_node_count <= (ushort)local_ba)) {
          ppaVar14 = std::
                     map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                     ::operator[](apcNodes,&local_ba);
          paVar21 = *ppaVar14;
        }
      }
      paVar11->mParent = paVar21;
      *(uint *)&p_Var15[1]._M_parent[0x20]._M_left = *(uint *)&p_Var4[10]._M_parent ^ 0x80000000;
      p_Var15[1]._M_parent[0x21]._M_color =
           *(_Rb_tree_color *)((long)&p_Var4[10]._M_parent + 4) ^ 0x80000000;
      *(uint *)&p_Var15[1]._M_parent[0x21]._M_left = *(uint *)&p_Var4[10]._M_left ^ 0x80000000;
      (paVar11->mTransformation).a4 = *(float *)&p_Var4[10]._M_parent;
      (paVar11->mTransformation).b4 = *(float *)((long)&p_Var4[10]._M_parent + 4);
      (paVar11->mTransformation).c4 = *(float *)&p_Var4[10]._M_left;
      local_b8.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)
           CONCAT62(local_b8.super_BaseProcess._vptr_BaseProcess._2_6_,
                    -2 - (short)p_Var15[1]._M_color);
      ppaVar14 = std::
                 map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                 ::operator[]((map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                               *)&local_60,(key_type_conflict *)&local_b8);
      *ppaVar14 = paVar11;
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      p_Var16 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      paVar11 = local_70;
      pmVar9 = local_68;
    } while ((_Rb_tree_header *)p_Var15 != p_Var1);
    for (; (_Rb_tree_header *)p_Var16 != &local_60._M_impl.super__Rb_tree_header;
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
      paVar5 = (mapped_type)p_Var16[1]._M_parent;
      ppaVar14 = std::
                 map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
                 ::operator[](apcNodes,(key_type_conflict *)(p_Var16 + 1));
      *ppaVar14 = paVar5;
    }
  }
  local_b8.super_BaseProcess._vptr_BaseProcess =
       (_func_int **)CONCAT62(local_b8.super_BaseProcess._vptr_BaseProcess._2_6_,0xffff);
  ppaVar14 = std::
             map<unsigned_short,_aiNode_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
             ::operator[](apcNodes,(key_type_conflict *)&local_b8);
  *ppaVar14 = paVar10;
  p_Var16 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  pLVar7 = local_78;
  while (local_78 = pLVar7, (_Rb_tree_header *)p_Var16 != p_Var1) {
    for (p_Var17 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var17 != p_Var1;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      if (((short)p_Var16[1]._M_color != (short)p_Var17[1]._M_color) &&
         (p_Var16[1]._M_parent == p_Var17[1]._M_parent[0x22]._M_parent)) {
        pp_Var2 = &p_Var16[1]._M_parent[0x22]._M_left;
        *(int *)pp_Var2 = *(int *)pp_Var2 + 1;
      }
    }
    uVar22 = (ulong)*(uint *)&p_Var16[1]._M_parent[0x22]._M_left;
    if (uVar22 != 0) {
      p_Var15 = (_Base_ptr)operator_new__(uVar22 << 3);
      p_Var16[1]._M_parent[0x22]._M_right = p_Var15;
      p_Var17 = (apcNodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var17 != p_Var1) {
        uVar22 = 0;
        do {
          if ((short)p_Var16[1]._M_color != (short)p_Var17[1]._M_color) {
            if (p_Var16[1]._M_parent == p_Var17[1]._M_parent[0x22]._M_parent) {
              *(_Base_ptr *)
               (&(p_Var16[1]._M_parent[0x22]._M_right)->_M_color + (uVar22 & 0xffff) * 2) =
                   p_Var17[1]._M_parent;
              uVar22 = (ulong)((int)uVar22 + 1);
            }
          }
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
        } while ((_Rb_tree_header *)p_Var17 != p_Var1);
      }
    }
    p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    pLVar7 = local_78;
  }
  paVar10 = pLVar7->pScene->mRootNode;
  uVar3 = paVar10->mNumChildren;
  if (uVar3 == 1) {
    ppaVar6 = paVar10->mChildren;
    paVar10 = *ppaVar6;
    *ppaVar6 = (aiNode *)0x0;
    paVar10->mParent = (aiNode *)0x0;
    paVar11 = pLVar7->pScene->mRootNode;
    if (paVar11 != (aiNode *)0x0) {
      aiNode::~aiNode(paVar11);
    }
    operator_delete(paVar11);
    pLVar7->pScene->mRootNode = paVar10;
  }
  else if (uVar3 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b8.super_BaseProcess._vptr_BaseProcess =
         (_func_int **)&local_b8.super_BaseProcess.progress;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"LWO: Unable to build a valid node graph","");
    std::runtime_error::runtime_error(this_00,(string *)&local_b8);
    *(undefined ***)this_00 = &PTR__runtime_error_00875f28;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  MakeLeftHandedProcess::MakeLeftHandedProcess(&local_b8);
  MakeLeftHandedProcess::Execute(&local_b8,pLVar7->pScene);
  FlipWindingOrderProcess::FlipWindingOrderProcess(&local_98);
  FlipWindingOrderProcess::Execute(&local_98,pLVar7->pScene);
  FlipWindingOrderProcess::~FlipWindingOrderProcess(&local_98);
  MakeLeftHandedProcess::~MakeLeftHandedProcess(&local_b8);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_aiNode_*>,_std::_Select1st<std::pair<const_unsigned_short,_aiNode_*>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_aiNode_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void LWOImporter::GenerateNodeGraph(std::map<uint16_t,aiNode*>& apcNodes)
{
    // now generate the final nodegraph - generate a root node and attach children
    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<LWORoot>");

    //Set parent of all children, inserting pivots
    //std::cout << "Set parent of all children" << std::endl;
    std::map<uint16_t, aiNode*> mapPivot;
    for (auto itapcNodes = apcNodes.begin(); itapcNodes != apcNodes.end(); ++itapcNodes) {

        //Get the parent index
        LWO::Layer* nodeLayer = (LWO::Layer*)(itapcNodes->second->mParent);
        uint16_t parentIndex = nodeLayer->mParent;

        //Create pivot node, store it into the pivot map, and set the parent as the pivot
        aiNode* pivotNode = new aiNode();
        pivotNode->mName.Set("Pivot-"+std::string(itapcNodes->second->mName.data));
        itapcNodes->second->mParent = pivotNode;

        //Look for the parent node to attach the pivot to
        if (apcNodes.find(parentIndex) != apcNodes.end()) {
            pivotNode->mParent = apcNodes[parentIndex];
        } else {
            //If not, attach to the root node
            pivotNode->mParent = root;
        }

        //Set the node and the pivot node transformation
        itapcNodes->second->mTransformation.a4 = -nodeLayer->mPivot.x;
        itapcNodes->second->mTransformation.b4 = -nodeLayer->mPivot.y;
        itapcNodes->second->mTransformation.c4 = -nodeLayer->mPivot.z;
        pivotNode->mTransformation.a4 = nodeLayer->mPivot.x;
        pivotNode->mTransformation.b4 = nodeLayer->mPivot.y;
        pivotNode->mTransformation.c4 = nodeLayer->mPivot.z;
        mapPivot[-(itapcNodes->first+2)] = pivotNode;
    }

    //Merge pivot map into node map
    //std::cout << "Merge pivot map into node map" << std::endl;
    for (auto itMapPivot = mapPivot.begin(); itMapPivot != mapPivot.end(); ++itMapPivot) {
        apcNodes[itMapPivot->first] = itMapPivot->second;
    }

    //Set children of all parents
    apcNodes[-1] = root;
    for (auto itMapParentNodes = apcNodes.begin(); itMapParentNodes != apcNodes.end(); ++itMapParentNodes) {
        for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
            if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                ++(itMapParentNodes->second->mNumChildren);
            }
        }
        if (itMapParentNodes->second->mNumChildren) {
            itMapParentNodes->second->mChildren = new aiNode* [ itMapParentNodes->second->mNumChildren ];
            uint16_t p = 0;
            for (auto itMapChildNodes = apcNodes.begin(); itMapChildNodes != apcNodes.end(); ++itMapChildNodes) {
                if ((itMapParentNodes->first != itMapChildNodes->first) && (itMapParentNodes->second == itMapChildNodes->second->mParent)) {
                    itMapParentNodes->second->mChildren[p++] = itMapChildNodes->second;
                }
            }
        }
    }

    if (!pScene->mRootNode->mNumChildren)
        throw DeadlyImportError("LWO: Unable to build a valid node graph");

    // Remove a single root node with no meshes assigned to it ...
    if (1 == pScene->mRootNode->mNumChildren)   {
        aiNode* pc = pScene->mRootNode->mChildren[0];
        pc->mParent = pScene->mRootNode->mChildren[0] = NULL;
        delete pScene->mRootNode;
        pScene->mRootNode = pc;
    }

    // convert the whole stuff to RH with CCW winding
    MakeLeftHandedProcess maker;
    maker.Execute(pScene);

    FlipWindingOrderProcess flipper;
    flipper.Execute(pScene);
}